

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_get_tile_descriptor
          (exr_const_context_t_conflict ctxt,int part_index,uint32_t *xsize,uint32_t *ysize,
          exr_tile_level_mode_t *level,exr_tile_round_mode_t *round)

{
  exr_priv_part_t p_Var1;
  exr_attribute_t *peVar2;
  exr_attr_tiledesc_t *peVar3;
  exr_result_t eVar4;
  exr_context_t nonc;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar4 = 2;
  }
  else {
    if (ctxt->mode == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
    }
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar4 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar4;
    }
    p_Var1 = ctxt->parts[(uint)part_index];
    peVar2 = p_Var1->tiles;
    if (peVar2 == (exr_attribute_t *)0x0) {
      eVar4 = 0xf;
    }
    else {
      if (peVar2->type != EXR_ATTR_TILEDESC) {
        if (ctxt->mode == '\x01') {
          pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
        }
        eVar4 = (*ctxt->print_error)
                          (ctxt,6,"Invalid required attribute type \'%s\' for \'tiles\'",
                           p_Var1->tiles->type_name,ctxt->print_error);
        return eVar4;
      }
      peVar3 = (peVar2->field_6).tiledesc;
      if (xsize != (uint32_t *)0x0) {
        *xsize = peVar3->x_size;
      }
      if (ysize != (uint32_t *)0x0) {
        *ysize = peVar3->y_size;
      }
      if (level != (exr_tile_level_mode_t *)0x0) {
        *level = peVar3->level_and_round & 0xf;
      }
      if (round != (exr_tile_round_mode_t *)0x0) {
        *round = (uint)(peVar3->level_and_round >> 4);
      }
      eVar4 = 0;
    }
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
  }
  return eVar4;
}

Assistant:

exr_result_t
exr_get_tile_descriptor (
    exr_const_context_t    ctxt,
    int                    part_index,
    uint32_t*              xsize,
    uint32_t*              ysize,
    exr_tile_level_mode_t* level,
    exr_tile_round_mode_t* round)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (part->tiles)
    {
        const exr_attr_tiledesc_t* out = part->tiles->tiledesc;

        if (part->tiles->type != EXR_ATTR_TILEDESC)
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_FILE_BAD_HEADER,
                "Invalid required attribute type '%s' for 'tiles'",
                part->tiles->type_name));

        if (xsize) *xsize = out->x_size;
        if (ysize) *ysize = out->y_size;
        if (level) *level = EXR_GET_TILE_LEVEL_MODE (*out);
        if (round) *round = EXR_GET_TILE_ROUND_MODE (*out);
        return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
    }
    return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_NO_ATTR_BY_NAME);
}